

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenReader
          (string *__return_storage_ptr__,SwiftGenerator *this,string *type,string *at)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *at_local;
  string *type_local;
  SwiftGenerator *this_local;
  
  local_28 = at;
  at_local = type;
  type_local = (string *)this;
  this_local = (SwiftGenerator *)__return_storage_ptr__;
  std::operator+(&local_88,"{{ACCESS}}.readBuffer(of: {{",type);
  std::operator+(&local_68,&local_88,"}}.self, at: ");
  std::operator+(&local_48,&local_68,local_28);
  std::operator+(__return_storage_ptr__,&local_48,")");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string GenReader(const std::string &type,
                        const std::string &at = "{{OFFSET}}") {
    return "{{ACCESS}}.readBuffer(of: {{" + type + "}}.self, at: " + at + ")";
  }